

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_fre.cc
# Opt level: O2

void ASN1_template_free(ASN1_VALUE **pval,ASN1_TEMPLATE *tt)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  size_t i;
  ulong i_00;
  ASN1_VALUE *vtmp;
  ASN1_VALUE *local_30;
  
  if ((tt->flags & 6) != 0) {
    sk = (OPENSSL_STACK *)*pval;
    i_00 = 0;
    while( true ) {
      sVar1 = OPENSSL_sk_num(sk);
      if (sVar1 <= i_00) break;
      local_30 = (ASN1_VALUE *)OPENSSL_sk_value(sk,i_00);
      ASN1_item_ex_free(&local_30,(ASN1_ITEM *)tt->field_name);
      i_00 = i_00 + 1;
    }
    OPENSSL_sk_free(sk);
    *pval = (ASN1_VALUE *)0x0;
    return;
  }
  ASN1_item_ex_free(pval,(ASN1_ITEM *)tt->field_name);
  return;
}

Assistant:

void ASN1_template_free(ASN1_VALUE **pval, const ASN1_TEMPLATE *tt) {
  if (tt->flags & ASN1_TFLG_SK_MASK) {
    STACK_OF(ASN1_VALUE) *sk = (STACK_OF(ASN1_VALUE) *)*pval;
    for (size_t i = 0; i < sk_ASN1_VALUE_num(sk); i++) {
      ASN1_VALUE *vtmp = sk_ASN1_VALUE_value(sk, i);
      ASN1_item_ex_free(&vtmp, ASN1_ITEM_ptr(tt->item));
    }
    sk_ASN1_VALUE_free(sk);
    *pval = NULL;
  } else {
    ASN1_item_ex_free(pval, ASN1_ITEM_ptr(tt->item));
  }
}